

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AdvancedSyncVertexArray::Run(AdvancedSyncVertexArray *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int iVar7;
  vec4 *expected;
  undefined8 local_30;
  undefined1 *puStack_28;
  
  bVar1 = ShaderImageLoadStoreBase::SupportedInVS(&this->super_ShaderImageLoadStoreBase,3);
  lVar6 = 0x10;
  if (bVar1) {
    GVar2 = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,
                       "#version 420 core\nlayout(rg32f) writeonly uniform imageBuffer g_position_buffer;\nlayout(rgba32f) writeonly uniform imageBuffer g_color_buffer;\nlayout(r32ui) writeonly uniform uimageBuffer g_element_buffer;\nuniform vec4 g_color;\nvoid main() {\n  vec2[4] data = vec2[4](vec2(-1, -1), vec2(1, -1), vec2(-1, 1), vec2(1, 1));\n  imageStore(g_position_buffer, gl_VertexID, vec4(data[gl_VertexID], 0.0, 1.0));\n  imageStore(g_color_buffer, gl_VertexID, g_color);\n  imageStore(g_element_buffer, gl_VertexID, uvec4(gl_VertexID));\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(bool *)0x0);
    this->m_store_program = GVar2;
    this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(this_00,GVar2);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,this->m_store_program,"g_position_buffer");
    glu::CallLogWrapper::glUniform1i(this_00,GVar3,0);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,this->m_store_program,"g_color_buffer");
    glu::CallLogWrapper::glUniform1i(this_00,GVar3,1);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,this->m_store_program,"g_element_buffer");
    glu::CallLogWrapper::glUniform1i(this_00,GVar3,2);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    GVar2 = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nlayout(location = 1) in vec4 i_color;\nout vec4 vs_color;\nvoid main() {\n  gl_Position = i_position;\n  vs_color = i_color;\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,
                       "#version 420 core\nin vec4 vs_color;\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vs_color;\n}"
                       ,(bool *)0x0);
    this->m_draw_program = GVar2;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_position_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_position_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x20,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_color_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_color_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x40,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_element_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_element_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x10,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_position_buffer_tex);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_position_buffer_tex);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8230,this->m_position_buffer);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
    glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_color_buffer_tex);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_color_buffer_tex);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8814,this->m_color_buffer);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
    glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_element_buffer_tex);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_element_buffer_tex);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8236,this->m_element_buffer);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_attribless_vao);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_draw_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_draw_vao);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_position_buffer);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_color_buffer);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,1,4,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_element_buffer);
    glu::CallLogWrapper::glBindVertexArray(this_00,0);
    glu::CallLogWrapper::glEnable(this_00,0x8c89);
    glu::CallLogWrapper::glBindImageTexture
              (this_00,0,this->m_position_buffer_tex,0,'\0',0,0x88b9,0x8230);
    glu::CallLogWrapper::glBindImageTexture
              (this_00,1,this->m_color_buffer_tex,0,'\0',0,0x88b9,0x8814);
    expected = (vec4 *)0x0;
    glu::CallLogWrapper::glBindImageTexture
              (this_00,2,this->m_element_buffer_tex,0,'\0',0,0x88b9,0x8236);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_store_program);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_store_program,"g_color");
    glu::CallLogWrapper::glUniform4f(this_00,GVar3,0.0,1.0,0.0,1.0);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_attribless_vao);
    glu::CallLogWrapper::glDrawArrays(this_00,0,0,4);
    glu::CallLogWrapper::glDisable(this_00,0x8c89);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_draw_program);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_draw_vao);
    glu::CallLogWrapper::glMemoryBarrier(this_00,3);
    iVar7 = 0;
    glu::CallLogWrapper::glDrawElements(this_00,5,4,0x1405,(void *)0x0);
    iVar4 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)CONCAT44(extraout_var,iVar4);
    iVar5 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_30 = 0x3f80000000000000;
    puStack_28 = (undefined1 *)0x3f80000000000000;
    bVar1 = ShaderImageLoadStoreBase::ValidateReadBuffer
                      (&this->super_ShaderImageLoadStoreBase,iVar4,
                       *(int *)(CONCAT44(extraout_var_00,iVar5) + 4),(int)&local_30,iVar7,expected);
    lVar6 = -1;
    if (bVar1) {
      glu::CallLogWrapper::glEnable(this_00,0x8c89);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_store_program);
      GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_store_program,"g_color");
      glu::CallLogWrapper::glUniform4f(this_00,GVar3,0.0,0.0,1.0,1.0);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_attribless_vao);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,4);
      glu::CallLogWrapper::glDisable(this_00,0x8c89);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_draw_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_draw_vao);
      glu::CallLogWrapper::glMemoryBarrier(this_00,3);
      iVar7 = 0;
      glu::CallLogWrapper::glDrawElements(this_00,5,4,0x1405,(void *)0x0);
      iVar4 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      iVar4 = *(int *)CONCAT44(extraout_var_01,iVar4);
      iVar5 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      local_30 = 0;
      puStack_28 = &DAT_3f8000003f800000;
      bVar1 = ShaderImageLoadStoreBase::ValidateReadBuffer
                        (&this->super_ShaderImageLoadStoreBase,iVar4,
                         *(int *)(CONCAT44(extraout_var_02,iVar5) + 4),(int)&local_30,iVar7,expected
                        );
      lVar6 = (ulong)bVar1 - 1;
    }
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(3))
			return NOT_SUPPORTED;
		const char* const glsl_store_vs =
			"#version 420 core" NL "layout(rg32f) writeonly uniform imageBuffer g_position_buffer;" NL
			"layout(rgba32f) writeonly uniform imageBuffer g_color_buffer;" NL
			"layout(r32ui) writeonly uniform uimageBuffer g_element_buffer;" NL "uniform vec4 g_color;" NL
			"void main() {" NL "  vec2[4] data = vec2[4](vec2(-1, -1), vec2(1, -1), vec2(-1, 1), vec2(1, 1));" NL
			"  imageStore(g_position_buffer, gl_VertexID, vec4(data[gl_VertexID], 0.0, 1.0));" NL
			"  imageStore(g_color_buffer, gl_VertexID, g_color);" NL
			"  imageStore(g_element_buffer, gl_VertexID, uvec4(gl_VertexID));" NL "}";
		const char* const glsl_draw_vs =
			"#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL
			"layout(location = 1) in vec4 i_color;" NL "out vec4 vs_color;" NL "void main() {" NL
			"  gl_Position = i_position;" NL "  vs_color = i_color;" NL "}";
		const char* const glsl_draw_fs =
			"#version 420 core" NL "in vec4 vs_color;" NL "layout(location = 0) out vec4 o_color;" NL "void main() {" NL
			"  o_color = vs_color;" NL "}";
		m_store_program = BuildProgram(glsl_store_vs, NULL, NULL, NULL, NULL);
		glUseProgram(m_store_program);
		glUniform1i(glGetUniformLocation(m_store_program, "g_position_buffer"), 0);
		glUniform1i(glGetUniformLocation(m_store_program, "g_color_buffer"), 1);
		glUniform1i(glGetUniformLocation(m_store_program, "g_element_buffer"), 2);
		glUseProgram(0);

		m_draw_program = BuildProgram(glsl_draw_vs, NULL, NULL, NULL, glsl_draw_fs);

		glGenBuffers(1, &m_position_buffer);
		glBindBuffer(GL_TEXTURE_BUFFER, m_position_buffer);
		glBufferData(GL_TEXTURE_BUFFER, sizeof(vec2) * 4, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);

		glGenBuffers(1, &m_color_buffer);
		glBindBuffer(GL_TEXTURE_BUFFER, m_color_buffer);
		glBufferData(GL_TEXTURE_BUFFER, sizeof(vec4) * 4, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);

		glGenBuffers(1, &m_element_buffer);
		glBindBuffer(GL_TEXTURE_BUFFER, m_element_buffer);
		glBufferData(GL_TEXTURE_BUFFER, sizeof(GLuint) * 4, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);

		glGenTextures(1, &m_position_buffer_tex);
		glBindTexture(GL_TEXTURE_BUFFER, m_position_buffer_tex);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_RG32F, m_position_buffer);
		glBindTexture(GL_TEXTURE_BUFFER, 0);

		glGenTextures(1, &m_color_buffer_tex);
		glBindTexture(GL_TEXTURE_BUFFER, m_color_buffer_tex);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32F, m_color_buffer);
		glBindTexture(GL_TEXTURE_BUFFER, 0);

		glGenTextures(1, &m_element_buffer_tex);
		glBindTexture(GL_TEXTURE_BUFFER, m_element_buffer_tex);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_R32UI, m_element_buffer);
		glBindTexture(GL_TEXTURE_BUFFER, 0);

		glGenVertexArrays(1, &m_attribless_vao);

		glGenVertexArrays(1, &m_draw_vao);
		glBindVertexArray(m_draw_vao);
		glBindBuffer(GL_ARRAY_BUFFER, m_position_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, m_color_buffer);
		glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_element_buffer);
		glBindVertexArray(0);

		glEnable(GL_RASTERIZER_DISCARD);
		glBindImageTexture(0, m_position_buffer_tex, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RG32F);
		glBindImageTexture(1, m_color_buffer_tex, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		glBindImageTexture(2, m_element_buffer_tex, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_R32UI);
		glUseProgram(m_store_program);
		glUniform4f(glGetUniformLocation(m_store_program, "g_color"), 0.0f, 1.0f, 0.0f, 1.0f);
		glBindVertexArray(m_attribless_vao);
		glDrawArrays(GL_POINTS, 0, 4);

		glDisable(GL_RASTERIZER_DISCARD);
		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_draw_program);
		glBindVertexArray(m_draw_vao);
		glMemoryBarrier(GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT | GL_ELEMENT_ARRAY_BARRIER_BIT);
		glDrawElements(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0);

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_store_program);
		glUniform4f(glGetUniformLocation(m_store_program, "g_color"), 0.0f, 0.0f, 1.0f, 1.0f);
		glBindVertexArray(m_attribless_vao);
		glDrawArrays(GL_POINTS, 0, 4);

		glDisable(GL_RASTERIZER_DISCARD);
		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_draw_program);
		glBindVertexArray(m_draw_vao);
		glMemoryBarrier(GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT | GL_ELEMENT_ARRAY_BARRIER_BIT);
		glDrawElements(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0);

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 0, 1, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}